

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O1

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::pop
          (stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this)

{
  size_type sVar1;
  group_pointer_type pgVar2;
  element_pointer_type pMVar3;
  
  sVar1 = this->total_number_of_elements;
  if (sVar1 == 0) {
    __assert_fail("total_number_of_elements != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/plf_stack/plf_stack.h"
                  ,0x3ce,
                  "void plf::stack<MatchingStateDebugFailures>::pop() [element_type = MatchingStateDebugFailures, element_allocator_type = std::allocator<MatchingStateDebugFailures>]"
                 );
  }
  this->total_number_of_elements = sVar1 - 1;
  if ((sVar1 != 1) && (this->top_element == this->start_element)) {
    pgVar2 = this->current_group->previous_group;
    this->current_group = pgVar2;
    this->start_element = pgVar2->elements;
    pMVar3 = pgVar2->end;
    this->top_element = pMVar3;
    this->end_element = pMVar3;
    return;
  }
  this->top_element = this->top_element + -1;
  return;
}

Assistant:

void pop() // Exception will occur if stack is empty
	{
		assert(total_number_of_elements != 0);

		#ifdef PLF_TYPE_TRAITS_SUPPORT
			if PLF_CONSTEXPR (!std::is_trivially_destructible<element_type>::value)
		#endif
		{
			PLF_DESTROY(element_allocator_type, *this, top_element);
		}

		// ie. if total_number_of_elements != 0 after decrement, or we were not already at the start of a non-first group
		if (total_number_of_elements-- == 1 || top_element != start_element) // If total_number_of_elements is now 0 after decrement, this essentially moves top_element back to it's initial position (start_element - 1). But otherwise, this is just a regular pop
		{
			--top_element;
		}
		else
		{ // ie. is start element, but not first group in stack (if it were, total_number_of_elements would be 0 after decrement)
			current_group = current_group->previous_group;
			start_element = current_group->elements;
			end_element = top_element = current_group->end;
		}
	}